

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O2

bool embree::avx512::InstanceIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,InstancePrimitive *prim)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  Instance *pIVar9;
  RTCPointQueryContext *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  bool bVar15;
  byte bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 uVar36;
  long lVar37;
  uint uVar38;
  uint uVar39;
  long lVar40;
  AffineSpace3ff *pAVar41;
  int iVar42;
  AffineSpace3ff *unaff_R13;
  AffineSpace3ff *pAVar43;
  uint uVar44;
  float fVar46;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar47;
  undefined1 auVar48 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar49;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar50;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar51;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar45;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  vfloat4 a0_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vfloat4 a0;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined4 uVar95;
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vfloat4 a0_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar116;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  vfloat4 b0;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vfloat4 a1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 in_ZMM18 [64];
  undefined8 local_d8;
  undefined4 local_d0;
  float local_cc;
  float local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  long local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  undefined1 local_78 [16];
  float local_68;
  void *local_60;
  undefined8 local_58;
  undefined1 local_48 [16];
  
  auVar48 = in_ZMM18._0_16_;
  pIVar9 = prim->instance;
  if ((pIVar9->super_Geometry).numTimeSteps == 1) {
    pAVar41 = pIVar9->local2world;
    if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar74 = (pAVar41->p).field_0.m128[3];
      fVar116 = (pAVar41->l).vx.field_0.m128[3];
      fVar46 = (pAVar41->l).vy.field_0.m128[3];
      fVar96 = (pAVar41->l).vz.field_0.m128[3];
      auVar59 = vxorps_avx512vl(auVar48,auVar48);
      auVar48 = vshufps_avx512vl((undefined1  [16])(pAVar41->l).vx.field_0,auVar59,0xe9);
      auVar48 = vblendps_avx(auVar48,(undefined1  [16])(pAVar41->l).vy.field_0,4);
      auVar55 = vfmadd213ss_fma(ZEXT416((uint)fVar74),ZEXT416((uint)fVar74),
                                ZEXT416((uint)(fVar116 * fVar116)));
      auVar55 = vfnmadd231ss_fma(auVar55,ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
      auVar57 = vfnmadd231ss_fma(auVar55,ZEXT416((uint)fVar96),ZEXT416((uint)fVar96));
      auVar58 = ZEXT416((uint)fVar46);
      auVar56 = ZEXT416((uint)fVar116);
      auVar55 = vfmadd213ss_fma(auVar58,auVar56,ZEXT416((uint)(fVar74 * fVar96)));
      fVar13 = auVar55._0_4_ + auVar55._0_4_;
      auVar53 = ZEXT416((uint)fVar96);
      auVar55 = vfmsub213ss_fma(auVar53,auVar56,ZEXT416((uint)(fVar74 * fVar46)));
      fVar11 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfmsub231ss_fma(ZEXT416((uint)(fVar74 * fVar96)),auVar56,auVar58);
      fVar96 = auVar55._0_4_ + auVar55._0_4_;
      auVar54 = vfmsub231ss_fma(ZEXT416((uint)(fVar116 * fVar116)),ZEXT416((uint)fVar74),
                                ZEXT416((uint)fVar74));
      auVar55 = vfmadd213ss_fma(auVar58,auVar58,auVar54);
      auVar58 = vfnmadd231ss_fma(auVar55,auVar53,auVar53);
      auVar60 = ZEXT416((uint)fVar46);
      auVar55 = vfmadd213ss_fma(auVar53,auVar60,ZEXT416((uint)(fVar74 * fVar116)));
      fVar12 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfmadd213ss_fma(auVar56,auVar53,ZEXT416((uint)(fVar74 * fVar46)));
      fVar46 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfmsub231ss_fma(ZEXT416((uint)(fVar74 * fVar116)),auVar60,auVar53);
      fVar74 = auVar55._0_4_ + auVar55._0_4_;
      auVar55 = vfnmadd231ss_fma(auVar54,auVar60,auVar60);
      auVar56 = vfmadd231ss_fma(auVar55,auVar53,auVar53);
      uVar95 = auVar57._0_4_;
      auVar106._4_4_ = uVar95;
      auVar106._0_4_ = uVar95;
      auVar106._8_4_ = uVar95;
      auVar106._12_4_ = uVar95;
      auVar113._4_4_ = fVar13;
      auVar113._0_4_ = fVar13;
      auVar113._8_4_ = fVar13;
      auVar113._12_4_ = fVar13;
      auVar121._0_4_ = fVar11 * 0.0;
      auVar121._4_4_ = fVar11 * 0.0;
      auVar121._8_4_ = fVar11 * 1.0;
      auVar121._12_4_ = fVar11 * 0.0;
      auVar60 = ZEXT816(0x3f80000000000000);
      auVar55 = vfmadd231ps_fma(auVar121,auVar60,auVar113);
      auVar57 = SUB6416(ZEXT464(0x3f800000),0);
      auVar55 = vfmadd231ps_fma(auVar55,auVar57,auVar106);
      auVar107._4_4_ = fVar96;
      auVar107._0_4_ = fVar96;
      auVar107._8_4_ = fVar96;
      auVar107._12_4_ = fVar96;
      uVar95 = auVar58._0_4_;
      auVar125._4_4_ = uVar95;
      auVar125._0_4_ = uVar95;
      auVar125._8_4_ = uVar95;
      auVar125._12_4_ = uVar95;
      auVar135._0_4_ = fVar12 * 0.0;
      auVar135._4_4_ = fVar12 * 0.0;
      auVar135._8_4_ = fVar12 * 1.0;
      auVar135._12_4_ = fVar12 * 0.0;
      auVar54 = vfmadd231ps_fma(auVar135,auVar60,auVar125);
      auVar54 = vfmadd231ps_fma(auVar54,auVar57,auVar107);
      auVar99._4_4_ = fVar46;
      auVar99._0_4_ = fVar46;
      auVar99._8_4_ = fVar46;
      auVar99._12_4_ = fVar46;
      auVar86._4_4_ = fVar74;
      auVar86._0_4_ = fVar74;
      auVar86._8_4_ = fVar74;
      auVar86._12_4_ = fVar74;
      fVar74 = auVar56._0_4_;
      auVar108._0_4_ = fVar74 * 0.0;
      auVar108._4_4_ = fVar74 * 0.0;
      auVar108._8_4_ = fVar74 * 1.0;
      auVar108._12_4_ = fVar74 * 0.0;
      auVar56 = vfmadd231ps_fma(auVar108,auVar60,auVar86);
      auVar56 = vfmadd231ps_fma(auVar56,auVar57,auVar99);
      auVar48 = vaddps_avx512vl(auVar48,auVar59);
      auVar57 = vmulps_avx512vl(auVar56,auVar59);
      auVar58 = vfmadd213ps_avx512vl(auVar59,auVar54,auVar57);
      uVar95 = *(undefined4 *)&(pAVar41->l).vx.field_0;
      auVar27._4_4_ = uVar95;
      auVar27._0_4_ = uVar95;
      auVar27._8_4_ = uVar95;
      auVar27._12_4_ = uVar95;
      aVar49 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar58,auVar55,auVar27);
      uVar95 = *(undefined4 *)((long)&(pAVar41->l).vy.field_0 + 4);
      auVar28._4_4_ = uVar95;
      auVar28._0_4_ = uVar95;
      auVar28._8_4_ = uVar95;
      auVar28._12_4_ = uVar95;
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar54,auVar28);
      uVar95 = *(undefined4 *)&(pAVar41->l).vy.field_0;
      auVar29._4_4_ = uVar95;
      auVar29._0_4_ = uVar95;
      auVar29._8_4_ = uVar95;
      auVar29._12_4_ = uVar95;
      aVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar57,auVar55,auVar29);
      uVar95 = *(undefined4 *)((long)&(pAVar41->l).vz.field_0 + 8);
      auVar30._4_4_ = uVar95;
      auVar30._0_4_ = uVar95;
      auVar30._8_4_ = uVar95;
      auVar30._12_4_ = uVar95;
      auVar57 = vmulps_avx512vl(auVar56,auVar30);
      uVar95 = *(undefined4 *)((long)&(pAVar41->l).vz.field_0 + 4);
      auVar31._4_4_ = uVar95;
      auVar31._0_4_ = uVar95;
      auVar31._8_4_ = uVar95;
      auVar31._12_4_ = uVar95;
      auVar57 = vfmadd231ps_avx512vl(auVar57,auVar54,auVar31);
      uVar95 = *(undefined4 *)&(pAVar41->l).vz.field_0;
      auVar32._4_4_ = uVar95;
      auVar32._0_4_ = uVar95;
      auVar32._8_4_ = uVar95;
      auVar32._12_4_ = uVar95;
      aVar51 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar57,auVar55,auVar32);
      uVar95 = *(undefined4 *)((long)&(pAVar41->p).field_0 + 8);
      auVar33._4_4_ = uVar95;
      auVar33._0_4_ = uVar95;
      auVar33._8_4_ = uVar95;
      auVar33._12_4_ = uVar95;
      auVar56 = vmulps_avx512vl(auVar56,auVar33);
      uVar95 = *(undefined4 *)((long)&(pAVar41->p).field_0 + 4);
      auVar34._4_4_ = uVar95;
      auVar34._0_4_ = uVar95;
      auVar34._8_4_ = uVar95;
      auVar34._12_4_ = uVar95;
      auVar54 = vfmadd231ps_avx512vl(auVar56,auVar54,auVar34);
      uVar95 = *(undefined4 *)&(pAVar41->p).field_0;
      auVar35._4_4_ = uVar95;
      auVar35._0_4_ = uVar95;
      auVar35._8_4_ = uVar95;
      auVar35._12_4_ = uVar95;
      auVar55 = vfmadd231ps_avx512vl(auVar54,auVar55,auVar35);
      aVar52 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vaddps_avx512vl(auVar48,auVar55);
    }
    else {
      aVar49 = (pAVar41->l).vx.field_0;
      aVar50 = (pAVar41->l).vy.field_0;
      aVar51 = (pAVar41->l).vz.field_0;
      aVar52 = (pAVar41->p).field_0;
    }
  }
  else {
    fVar74 = (pIVar9->super_Geometry).fnumTimeSegments;
    fVar116 = (pIVar9->super_Geometry).time_range.lower;
    fVar116 = fVar74 * ((query->time - fVar116) /
                       ((pIVar9->super_Geometry).time_range.upper - fVar116));
    auVar55 = vroundss_avx(ZEXT416((uint)fVar116),ZEXT416((uint)fVar116),9);
    auVar55 = vminss_avx(auVar55,ZEXT416((uint)(fVar74 + -1.0)));
    auVar54._0_12_ = ZEXT812(0);
    auVar54._12_4_ = 0;
    auVar55 = vmaxss_avx(auVar54,auVar55);
    fVar116 = fVar116 - auVar55._0_4_;
    iVar42 = (int)auVar55._0_4_;
    pAVar41 = pIVar9->local2world + CONCAT44((int)((ulong)unaff_R13 >> 0x20),iVar42);
    unaff_R13 = pIVar9->local2world + (iVar42 + 1);
    if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
      uVar39 = *(uint *)((long)&(pAVar41->p).field_0 + 0xc);
      uVar2 = *(uint *)((long)&(pAVar41->l).vx.field_0 + 0xc);
      uVar3 = *(uint *)((long)&(pAVar41->l).vy.field_0 + 0xc);
      uVar4 = *(uint *)((long)&(pAVar41->l).vz.field_0 + 0xc);
      uVar38 = *(uint *)((long)&(unaff_R13->p).field_0 + 0xc);
      uVar45 = *(uint *)((long)&(unaff_R13->l).vx.field_0 + 0xc);
      uVar44 = *(uint *)((long)&(unaff_R13->l).vy.field_0 + 0xc);
      uVar5 = *(uint *)((long)&(unaff_R13->l).vz.field_0 + 0xc);
      auVar55 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416(uVar45));
      auVar55 = vfmadd231ss_avx512f(auVar55,ZEXT416(uVar39),ZEXT416(uVar38));
      auVar55 = vfmadd231ss_avx512f(auVar55,ZEXT416(uVar3),ZEXT416(uVar44));
      auVar54 = vfmadd231ss_avx512f(auVar55,ZEXT416(uVar4),ZEXT416(uVar5));
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar55 = vxorps_avx512vl(auVar54,auVar69);
      bVar15 = auVar54._0_4_ < auVar55._0_4_;
      auVar56 = vxorps_avx512vl(ZEXT416(uVar38),auVar69);
      auVar57 = vxorps_avx512vl(ZEXT416(uVar45),auVar69);
      auVar58 = vxorps_avx512vl(ZEXT416(uVar44),auVar69);
      auVar59 = vxorps_avx512vl(ZEXT416(uVar5),auVar69);
      auVar56 = ZEXT416((uint)bVar15 * auVar56._0_4_ + !bVar15 * uVar38);
      auVar57 = ZEXT416((uint)bVar15 * auVar57._0_4_ + !bVar15 * uVar45);
      auVar58 = ZEXT416((uint)bVar15 * auVar58._0_4_ + !bVar15 * uVar44);
      auVar59 = ZEXT416((uint)bVar15 * auVar59._0_4_ + !bVar15 * uVar5);
      auVar60 = vmaxss_avx512f(auVar55,auVar54);
      auVar55._8_4_ = 0x7fffffff;
      auVar55._0_8_ = 0x7fffffff7fffffff;
      auVar55._12_4_ = 0x7fffffff;
      auVar54 = vandps_avx512vl(auVar54,auVar55);
      auVar55 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar54,ZEXT416(0x3c9df1b8));
      auVar55 = vfmadd213ss_fma(auVar55,auVar54,ZEXT416(0xbd37e81c));
      auVar55 = vfmadd213ss_fma(auVar55,auVar54,ZEXT416(0x3db3edac));
      auVar55 = vfmadd213ss_fma(auVar55,auVar54,ZEXT416(0xbe5ba881));
      auVar55 = vfmadd213ss_fma(auVar55,auVar54,ZEXT416(0x3fc90fd1));
      auVar53 = vsubss_avx512f(ZEXT416(0x3f800000),auVar54);
      if (auVar53._0_4_ < 0.0) {
        fVar74 = sqrtf(auVar53._0_4_);
        auVar69 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar60 = ZEXT416(auVar60._0_4_);
      }
      else {
        auVar53 = vsqrtss_avx(auVar53,auVar53);
        fVar74 = auVar53._0_4_;
      }
      auVar63 = ZEXT416((uint)fVar116);
      auVar55 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar74 * auVar55._0_4_)));
      auVar53 = vxorps_avx512vl(auVar55,auVar69);
      uVar14 = vcmpss_avx512f(auVar60,ZEXT816(0) << 0x40,1);
      bVar15 = (bool)((byte)uVar14 & 1);
      auVar64 = ZEXT416(0x3f800000);
      uVar14 = vcmpss_avx512f(auVar64,auVar54,1);
      bVar17 = (bool)((byte)uVar14 & 1);
      fVar74 = fVar116 * (float)((uint)bVar17 * 0x7fc00000 +
                                (uint)!bVar17 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar15 * auVar53._0_4_ +
                                            (uint)!bVar15 * auVar55._0_4_)));
      auVar55 = ZEXT416((uint)(fVar74 * 0.63661975));
      auVar55 = vroundss_avx(auVar55,auVar55,9);
      auVar54 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar55,ZEXT416((uint)fVar74));
      uVar38 = (int)auVar55._0_4_ & 3;
      uVar45 = uVar38 - 1;
      fVar46 = auVar54._0_4_;
      fVar74 = fVar46 * fVar46;
      auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar74),
                                ZEXT416(0x363938a8));
      auVar53 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar74),
                                ZEXT416(0x37cfab9c));
      auVar66 = ZEXT416((uint)fVar74);
      auVar54 = vfmadd213ss_fma(auVar54,auVar66,ZEXT416(0xb9501096));
      auVar53 = vfmadd213ss_fma(auVar53,auVar66,ZEXT416(0xbab60981));
      auVar54 = vfmadd213ss_fma(auVar54,auVar66,ZEXT416(0x3c088898));
      auVar53 = vfmadd213ss_fma(auVar53,auVar66,ZEXT416(0x3d2aaaa4));
      auVar66 = ZEXT416((uint)fVar74);
      auVar54 = vfmadd213ss_fma(auVar54,auVar66,ZEXT416(0xbe2aaaab));
      auVar53 = vfmadd213ss_fma(auVar53,auVar66,SUB6416(ZEXT464(0xbf000000),0));
      auVar54 = vfmadd213ss_avx512f(auVar54,auVar66,auVar64);
      auVar53 = vfmadd213ss_avx512f(auVar53,auVar66,auVar64);
      fVar46 = fVar46 * auVar54._0_4_;
      bVar16 = (byte)(int)auVar55._0_4_;
      uVar44 = (uint)(bVar16 & 1) * auVar53._0_4_ + (uint)!(bool)(bVar16 & 1) * (int)fVar46;
      auVar53._0_4_ = (uint)(bVar16 & 1) * (int)fVar46 + (uint)!(bool)(bVar16 & 1) * auVar53._0_4_;
      auVar55 = vxorps_avx512vl(auVar53,auVar69);
      auVar66._0_4_ = (uint)(uVar45 < 2) * auVar55._0_4_ + (uint)(uVar45 >= 2) * auVar53._0_4_;
      auVar66._4_12_ = auVar53._4_12_;
      auVar54 = vfmsub213ss_avx512f(ZEXT416(uVar39),auVar60,auVar56);
      auVar55 = vfmsub213ss_avx512f(ZEXT416(uVar2),auVar60,auVar57);
      auVar53 = vfmsub213ss_avx512f(ZEXT416(uVar3),auVar60,auVar58);
      auVar60 = vfmsub213ss_avx512f(ZEXT416(uVar4),auVar60,auVar59);
      fVar96 = auVar55._0_4_;
      auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * fVar96)),auVar54,auVar54);
      auVar55 = vfmadd231ss_fma(auVar55,auVar53,auVar53);
      auVar55 = vfmadd231ss_fma(auVar55,auVar60,auVar60);
      auVar61 = vxorps_avx512vl(auVar48,auVar48);
      auVar62._4_12_ = auVar61._4_12_;
      auVar62._0_4_ = auVar55._0_4_;
      auVar48 = vrsqrt14ss_avx512f(auVar61,auVar62);
      fVar74 = auVar48._0_4_;
      fVar74 = fVar74 * 1.5 + fVar74 * fVar74 * fVar74 * auVar55._0_4_ * -0.5;
      auVar48 = vxorps_avx512vl(ZEXT416(uVar44),auVar69);
      fVar46 = (float)((1 < uVar38) * uVar44 + (uint)(1 >= uVar38) * auVar48._0_4_);
      auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar74 * fVar46)),auVar66,
                                ZEXT416(uVar39));
      auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * fVar74 * fVar46)),auVar66,ZEXT416(uVar2));
      auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar74 * fVar46)),auVar66,
                                ZEXT416(uVar3));
      auVar60 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar74 * fVar46)),ZEXT416(uVar4),
                                auVar66);
      auVar53 = vsubss_avx512f(auVar64,auVar63);
      auVar56 = vmulss_avx512f(auVar63,auVar56);
      auVar56 = vfmadd231ss_fma(auVar56,auVar53,ZEXT416(uVar39));
      auVar57 = vmulss_avx512f(auVar63,auVar57);
      auVar57 = vfmadd231ss_fma(auVar57,auVar53,ZEXT416(uVar2));
      auVar58 = vmulss_avx512f(auVar63,auVar58);
      auVar58 = vfmadd231ss_fma(auVar58,auVar53,ZEXT416(uVar3));
      auVar59 = vmulss_avx512f(auVar63,auVar59);
      auVar59 = vfmadd231ss_fma(auVar59,auVar53,ZEXT416(uVar4));
      fVar46 = auVar57._0_4_;
      auVar57 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar46)),auVar56,auVar56);
      auVar57 = vfmadd231ss_fma(auVar57,auVar58,auVar58);
      auVar57 = vfmadd231ss_fma(auVar57,auVar59,auVar59);
      auVar69._4_12_ = auVar62._4_12_;
      auVar69._0_4_ = auVar57._0_4_;
      auVar69 = vrsqrt14ss_avx512f(auVar61,auVar69);
      fVar74 = auVar69._0_4_;
      fVar74 = fVar74 * 1.5 + fVar74 * fVar74 * fVar74 * auVar57._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar15 = 2 < uVar45;
      auVar63._4_12_ = auVar48._4_12_;
      auVar63._0_4_ =
           (float)((uint)bVar15 * (int)(auVar56._0_4_ * fVar74) + (uint)!bVar15 * auVar48._0_4_);
      auVar64._4_12_ = auVar55._4_12_;
      auVar64._0_4_ = (float)((uint)bVar15 * (int)(fVar46 * fVar74) + (uint)!bVar15 * auVar55._0_4_)
      ;
      auVar65._4_12_ = auVar54._4_12_;
      auVar65._0_4_ =
           (float)((uint)bVar15 * (int)(auVar58._0_4_ * fVar74) + (uint)!bVar15 * auVar54._0_4_);
      auVar60._0_4_ =
           (float)((uint)bVar15 * (int)(auVar59._0_4_ * fVar74) + (uint)!bVar15 * auVar60._0_4_);
      auVar126._0_4_ = fVar116 * (unaff_R13->l).vx.field_0.m128[0];
      auVar126._4_4_ = fVar116 * (unaff_R13->l).vx.field_0.m128[1];
      auVar126._8_4_ = fVar116 * (unaff_R13->l).vx.field_0.m128[2];
      auVar126._12_4_ = fVar116 * (unaff_R13->l).vx.field_0.m128[3];
      uVar95 = auVar53._0_4_;
      auVar129._4_4_ = uVar95;
      auVar129._0_4_ = uVar95;
      auVar129._8_4_ = uVar95;
      auVar129._12_4_ = uVar95;
      auVar55 = vfmadd231ps_fma(auVar126,auVar129,(undefined1  [16])(pAVar41->l).vx.field_0);
      auVar122._0_4_ = fVar116 * (unaff_R13->l).vy.field_0.m128[0];
      auVar122._4_4_ = fVar116 * (unaff_R13->l).vy.field_0.m128[1];
      auVar122._8_4_ = fVar116 * (unaff_R13->l).vy.field_0.m128[2];
      auVar122._12_4_ = fVar116 * (unaff_R13->l).vy.field_0.m128[3];
      auVar54 = vfmadd231ps_fma(auVar122,auVar129,(undefined1  [16])(pAVar41->l).vy.field_0);
      auVar118._0_4_ = fVar116 * (unaff_R13->l).vz.field_0.m128[0];
      auVar118._4_4_ = fVar116 * (unaff_R13->l).vz.field_0.m128[1];
      auVar118._8_4_ = fVar116 * (unaff_R13->l).vz.field_0.m128[2];
      auVar118._12_4_ = fVar116 * (unaff_R13->l).vz.field_0.m128[3];
      auVar56 = vfmadd231ps_fma(auVar118,auVar129,(undefined1  [16])(pAVar41->l).vz.field_0);
      auVar48._0_4_ = fVar116 * (unaff_R13->p).field_0.m128[0];
      auVar48._4_4_ = fVar116 * (unaff_R13->p).field_0.m128[1];
      auVar48._8_4_ = fVar116 * (unaff_R13->p).field_0.m128[2];
      auVar48._12_4_ = fVar116 * (unaff_R13->p).field_0.m128[3];
      auVar57 = vfmadd231ps_fma(auVar48,auVar129,(undefined1  [16])(pAVar41->p).field_0);
      auVar48 = vshufps_avx512vl(auVar55,auVar61,0xe9);
      auVar48 = vblendps_avx(auVar48,auVar54,4);
      auVar58 = vfmadd213ss_fma(auVar63,auVar63,ZEXT416((uint)(auVar64._0_4_ * auVar64._0_4_)));
      auVar58 = vfnmadd231ss_fma(auVar58,auVar65,auVar65);
      auVar53 = vfnmadd231ss_fma(auVar58,auVar60,auVar60);
      auVar58 = vfmadd213ss_fma(auVar65,auVar64,ZEXT416((uint)(auVar63._0_4_ * auVar60._0_4_)));
      fVar74 = auVar58._0_4_ + auVar58._0_4_;
      auVar58 = vfmsub213ss_fma(auVar60,auVar64,ZEXT416((uint)(auVar63._0_4_ * auVar65._0_4_)));
      fVar116 = auVar58._0_4_ + auVar58._0_4_;
      auVar58 = vfmsub231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar60._0_4_)),auVar64,auVar65);
      fVar46 = auVar58._0_4_ + auVar58._0_4_;
      auVar59 = vfmsub231ss_fma(ZEXT416((uint)(auVar64._0_4_ * auVar64._0_4_)),auVar63,auVar63);
      auVar58 = vfmadd213ss_fma(auVar65,auVar65,auVar59);
      auVar69 = vfnmadd231ss_fma(auVar58,auVar60,auVar60);
      auVar58 = vfmadd213ss_avx512f(auVar60,auVar65,ZEXT416((uint)(auVar63._0_4_ * auVar64._0_4_)));
      auVar66 = vaddss_avx512f(auVar58,auVar58);
      auVar58 = vfmadd213ss_fma(auVar64,auVar60,ZEXT416((uint)(auVar63._0_4_ * auVar65._0_4_)));
      fVar96 = auVar58._0_4_ + auVar58._0_4_;
      auVar58 = vfmsub231ss_fma(ZEXT416((uint)(auVar63._0_4_ * auVar64._0_4_)),auVar65,auVar60);
      fVar13 = auVar58._0_4_ + auVar58._0_4_;
      auVar58 = vfnmadd231ss_fma(auVar59,auVar65,auVar65);
      auVar60 = vfmadd231ss_fma(auVar58,auVar60,auVar60);
      uVar95 = auVar53._0_4_;
      auVar59._4_4_ = uVar95;
      auVar59._0_4_ = uVar95;
      auVar59._8_4_ = uVar95;
      auVar59._12_4_ = uVar95;
      auVar58._4_4_ = fVar74;
      auVar58._0_4_ = fVar74;
      auVar58._8_4_ = fVar74;
      auVar58._12_4_ = fVar74;
      auVar137._0_4_ = fVar116 * 0.0;
      auVar137._4_4_ = fVar116 * 0.0;
      auVar137._8_4_ = fVar116 * 1.0;
      auVar137._12_4_ = fVar116 * 0.0;
      auVar53 = ZEXT816(0x3f80000000000000);
      auVar58 = vfmadd231ps_fma(auVar137,auVar53,auVar58);
      auVar62 = SUB6416(ZEXT464(0x3f800000),0);
      auVar58 = vfmadd231ps_fma(auVar58,auVar62,auVar59);
      auVar79._4_4_ = fVar46;
      auVar79._0_4_ = fVar46;
      auVar79._8_4_ = fVar46;
      auVar79._12_4_ = fVar46;
      uVar95 = auVar69._0_4_;
      auVar87._4_4_ = uVar95;
      auVar87._0_4_ = uVar95;
      auVar87._8_4_ = uVar95;
      auVar87._12_4_ = uVar95;
      auVar59 = vbroadcastss_avx512vl(auVar66);
      auVar136._0_4_ = auVar59._0_4_ * 0.0;
      auVar136._4_4_ = auVar59._4_4_ * 0.0;
      auVar136._8_4_ = auVar59._8_4_ * 1.0;
      auVar136._12_4_ = auVar59._12_4_ * 0.0;
      auVar59 = vfmadd231ps_fma(auVar136,auVar53,auVar87);
      auVar59 = vfmadd231ps_fma(auVar59,auVar62,auVar79);
      auVar80._4_4_ = fVar96;
      auVar80._0_4_ = fVar96;
      auVar80._8_4_ = fVar96;
      auVar80._12_4_ = fVar96;
      auVar88._4_4_ = fVar13;
      auVar88._0_4_ = fVar13;
      auVar88._8_4_ = fVar13;
      auVar88._12_4_ = fVar13;
      fVar74 = auVar60._0_4_;
      auVar100._0_4_ = fVar74 * 0.0;
      auVar100._4_4_ = fVar74 * 0.0;
      auVar100._8_4_ = fVar74 * 1.0;
      auVar100._12_4_ = fVar74 * 0.0;
      auVar60 = vfmadd231ps_fma(auVar100,auVar53,auVar88);
      auVar60 = vfmadd231ps_fma(auVar60,auVar62,auVar80);
      auVar53 = vaddps_avx512vl(auVar48,auVar61);
      uVar95 = auVar55._0_4_;
      auVar89._4_4_ = uVar95;
      auVar89._0_4_ = uVar95;
      auVar89._8_4_ = uVar95;
      auVar89._12_4_ = uVar95;
      auVar48 = vmulps_avx512vl(auVar60,auVar61);
      auVar55 = vfmadd213ps_avx512vl(auVar61,auVar59,auVar48);
      aVar49 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar55,auVar58,auVar89);
      uVar95 = auVar54._0_4_;
      auVar61._4_4_ = uVar95;
      auVar61._0_4_ = uVar95;
      auVar61._8_4_ = uVar95;
      auVar61._12_4_ = uVar95;
      auVar55 = vshufps_avx512vl(auVar54,auVar54,0x55);
      auVar48 = vfmadd213ps_avx512vl(auVar55,auVar59,auVar48);
      aVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar48,auVar58,auVar61);
      uVar95 = auVar56._0_4_;
      auVar90._4_4_ = uVar95;
      auVar90._0_4_ = uVar95;
      auVar90._8_4_ = uVar95;
      auVar90._12_4_ = uVar95;
      auVar48 = vshufps_avx(auVar56,auVar56,0x55);
      auVar55 = vshufps_avx(auVar56,auVar56,0xaa);
      auVar55 = vmulps_avx512vl(auVar55,auVar60);
      auVar48 = vfmadd231ps_avx512vl(auVar55,auVar59,auVar48);
      aVar51 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vfmadd231ps_avx512vl(auVar48,auVar58,auVar90);
      uVar95 = auVar57._0_4_;
      auVar56._4_4_ = uVar95;
      auVar56._0_4_ = uVar95;
      auVar56._8_4_ = uVar95;
      auVar56._12_4_ = uVar95;
      auVar48 = vshufps_avx(auVar57,auVar57,0x55);
      auVar55 = vshufps_avx(auVar57,auVar57,0xaa);
      auVar57._0_4_ = auVar55._0_4_ * auVar60._0_4_;
      auVar57._4_4_ = auVar55._4_4_ * auVar60._4_4_;
      auVar57._8_4_ = auVar55._8_4_ * auVar60._8_4_;
      auVar57._12_4_ = auVar55._12_4_ * auVar60._12_4_;
      auVar48 = vfmadd231ps_fma(auVar57,auVar59,auVar48);
      auVar48 = vfmadd231ps_fma(auVar48,auVar58,auVar56);
      aVar52 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vaddps_avx512vl(auVar53,auVar48);
    }
    else {
      fVar74 = 1.0 - fVar116;
      auVar82._4_4_ = fVar116;
      auVar82._0_4_ = fVar116;
      auVar82._8_4_ = fVar116;
      auVar82._12_4_ = fVar116;
      auVar48 = vmulps_avx512vl(auVar82,(undefined1  [16])(unaff_R13->l).vx.field_0);
      auVar75._4_4_ = fVar74;
      auVar75._0_4_ = fVar74;
      auVar75._8_4_ = fVar74;
      auVar75._12_4_ = fVar74;
      aVar49.m128 = (__m128)vfmadd231ps_avx512vl(auVar48,auVar75,(pAVar41->l).vx.field_0);
      auVar48 = vmulps_avx512vl(auVar82,(undefined1  [16])(unaff_R13->l).vy.field_0);
      aVar50.m128 = (__m128)vfmadd231ps_avx512vl(auVar48,auVar75,(pAVar41->l).vy.field_0);
      auVar48 = vmulps_avx512vl(auVar82,(undefined1  [16])(unaff_R13->l).vz.field_0);
      aVar51.m128 = (__m128)vfmadd231ps_avx512vl(auVar48,auVar75,(pAVar41->l).vz.field_0);
      auVar48 = vmulps_avx512vl(auVar82,(undefined1  [16])(unaff_R13->p).field_0);
      aVar52.m128 = (__m128)vfmadd231ps_avx512vl(auVar48,auVar75,(pAVar41->p).field_0);
    }
  }
  if ((pIVar9->super_Geometry).numTimeSteps == 1) {
    aVar6 = (pIVar9->world2local0).l.vx.field_0;
    aVar7 = (pIVar9->world2local0).l.vy.field_0;
    aVar8 = (pIVar9->world2local0).l.vz.field_0;
    aVar47 = (pIVar9->world2local0).p.field_0;
  }
  else {
    fVar74 = (pIVar9->super_Geometry).fnumTimeSegments;
    fVar116 = (pIVar9->super_Geometry).time_range.lower;
    fVar116 = fVar74 * ((query->time - fVar116) /
                       ((pIVar9->super_Geometry).time_range.upper - fVar116));
    auVar48 = vroundss_avx(ZEXT416((uint)fVar116),ZEXT416((uint)fVar116),9);
    auVar48 = vminss_avx(auVar48,ZEXT416((uint)(fVar74 + -1.0)));
    auVar83._0_12_ = ZEXT812(0);
    auVar83._12_4_ = 0;
    auVar48 = vmaxss_avx(auVar83,auVar48);
    fVar116 = fVar116 - auVar48._0_4_;
    iVar42 = (int)auVar48._0_4_;
    pAVar41 = pIVar9->local2world + CONCAT44((int)((ulong)unaff_R13 >> 0x20),iVar42);
    pAVar43 = pIVar9->local2world + (iVar42 + 1);
    if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
      uVar39 = *(uint *)((long)&(pAVar41->p).field_0 + 0xc);
      uVar2 = *(uint *)((long)&(pAVar41->l).vx.field_0 + 0xc);
      uVar3 = *(uint *)((long)&(pAVar41->l).vy.field_0 + 0xc);
      uVar4 = *(uint *)((long)&(pAVar41->l).vz.field_0 + 0xc);
      uVar38 = *(uint *)((long)&(pAVar43->p).field_0 + 0xc);
      uVar45 = *(uint *)((long)&(pAVar43->l).vx.field_0 + 0xc);
      uVar44 = *(uint *)((long)&(pAVar43->l).vy.field_0 + 0xc);
      uVar5 = *(uint *)((long)&(pAVar43->l).vz.field_0 + 0xc);
      auVar48 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416(uVar45));
      auVar48 = vfmadd231ss_avx512f(auVar48,ZEXT416(uVar39),ZEXT416(uVar38));
      auVar48 = vfmadd231ss_avx512f(auVar48,ZEXT416(uVar3),ZEXT416(uVar44));
      auVar48 = vfmadd231ss_avx512f(auVar48,ZEXT416(uVar4),ZEXT416(uVar5));
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar54 = vxorps_avx512vl(auVar48,auVar53);
      bVar15 = auVar48._0_4_ < auVar54._0_4_;
      auVar55 = vxorps_avx512vl(ZEXT416(uVar38),auVar53);
      auVar56 = vxorps_avx512vl(ZEXT416(uVar45),auVar53);
      auVar57 = vxorps_avx512vl(ZEXT416(uVar44),auVar53);
      auVar58 = vxorps_avx512vl(ZEXT416(uVar5),auVar53);
      auVar55 = ZEXT416((uint)bVar15 * auVar55._0_4_ + !bVar15 * uVar38);
      auVar56 = ZEXT416((uint)bVar15 * auVar56._0_4_ + !bVar15 * uVar45);
      auVar57 = ZEXT416((uint)bVar15 * auVar57._0_4_ + !bVar15 * uVar44);
      auVar58 = ZEXT416((uint)bVar15 * auVar58._0_4_ + !bVar15 * uVar5);
      auVar59 = vmaxss_avx512f(auVar54,auVar48);
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar54 = vandps_avx512vl(auVar48,auVar26);
      auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbb8d3753),0),auVar54,ZEXT416(0x3c9df1b8));
      auVar48 = vfmadd213ss_fma(auVar48,auVar54,ZEXT416(0xbd37e81c));
      auVar48 = vfmadd213ss_fma(auVar48,auVar54,ZEXT416(0x3db3edac));
      auVar48 = vfmadd213ss_fma(auVar48,auVar54,ZEXT416(0xbe5ba881));
      auVar48 = vfmadd213ss_fma(auVar48,auVar54,ZEXT416(0x3fc90fd1));
      auVar60 = vsubss_avx512f(ZEXT416(0x3f800000),auVar54);
      if (auVar60._0_4_ < 0.0) {
        local_b8 = auVar54;
        local_a8 = auVar55;
        fVar74 = sqrtf(auVar60._0_4_);
        auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar59 = ZEXT416(auVar59._0_4_);
        auVar55 = local_a8;
        auVar54 = local_b8;
      }
      else {
        auVar60 = vsqrtss_avx(auVar60,auVar60);
        fVar74 = auVar60._0_4_;
      }
      auVar61 = ZEXT416(uVar39);
      auVar62 = ZEXT416(0x3f800000);
      auVar66 = ZEXT416((uint)fVar116);
      auVar48 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(1.5707964 - fVar74 * auVar48._0_4_)));
      auVar60 = vxorps_avx512vl(auVar48,auVar53);
      uVar14 = vcmpss_avx512f(auVar59,ZEXT816(0) << 0x40,1);
      bVar15 = (bool)((byte)uVar14 & 1);
      uVar14 = vcmpss_avx512f(auVar62,auVar54,1);
      bVar17 = (bool)((byte)uVar14 & 1);
      fVar74 = fVar116 * (float)((uint)bVar17 * 0x7fc00000 +
                                (uint)!bVar17 *
                                (int)(1.5707964 -
                                     (float)((uint)bVar15 * auVar60._0_4_ +
                                            (uint)!bVar15 * auVar48._0_4_)));
      auVar48 = ZEXT416((uint)(fVar74 * 0.63661975));
      auVar48 = vroundss_avx(auVar48,auVar48,9);
      auVar54 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3fc90fdb),0),auVar48,ZEXT416((uint)fVar74));
      uVar39 = (int)auVar48._0_4_ & 3;
      uVar38 = uVar39 - 1;
      fVar46 = auVar54._0_4_;
      fVar74 = fVar46 * fVar46;
      auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb2d70013),0),ZEXT416((uint)fVar74),
                                ZEXT416(0x363938a8));
      auVar60 = vfmadd213ss_fma(SUB6416(ZEXT464(0xb48b634d),0),ZEXT416((uint)fVar74),
                                ZEXT416(0x37cfab9c));
      auVar69 = ZEXT416((uint)fVar74);
      auVar54 = vfmadd213ss_fma(auVar54,auVar69,ZEXT416(0xb9501096));
      auVar60 = vfmadd213ss_fma(auVar60,auVar69,ZEXT416(0xbab60981));
      auVar54 = vfmadd213ss_fma(auVar54,auVar69,ZEXT416(0x3c088898));
      auVar60 = vfmadd213ss_fma(auVar60,auVar69,ZEXT416(0x3d2aaaa4));
      auVar69 = ZEXT416((uint)fVar74);
      auVar54 = vfmadd213ss_fma(auVar54,auVar69,ZEXT416(0xbe2aaaab));
      auVar60 = vfmadd213ss_fma(auVar60,auVar69,SUB6416(ZEXT464(0xbf000000),0));
      auVar54 = vfmadd213ss_avx512f(auVar54,auVar69,auVar62);
      auVar60 = vfmadd213ss_avx512f(auVar60,auVar69,auVar62);
      fVar46 = fVar46 * auVar54._0_4_;
      bVar16 = (byte)(int)auVar48._0_4_;
      uVar45 = (uint)(bVar16 & 1) * auVar60._0_4_ + (uint)!(bool)(bVar16 & 1) * (int)fVar46;
      auVar67._4_12_ = auVar60._4_12_;
      auVar67._0_4_ = (uint)(bVar16 & 1) * (int)fVar46 + (uint)!(bool)(bVar16 & 1) * auVar60._0_4_;
      auVar48 = vxorps_avx512vl(auVar67,auVar53);
      auVar68._0_4_ = (uint)(uVar38 < 2) * auVar48._0_4_ + (uint)(uVar38 >= 2) * auVar67._0_4_;
      auVar68._4_12_ = auVar67._4_12_;
      auVar54 = vfmsub213ss_avx512f(auVar61,auVar59,auVar55);
      auVar48 = vfmsub213ss_avx512f(ZEXT416(uVar2),auVar59,auVar56);
      auVar60 = vfmsub213ss_avx512f(ZEXT416(uVar3),auVar59,auVar57);
      auVar59 = vfmsub213ss_avx512f(ZEXT416(uVar4),auVar59,auVar58);
      fVar96 = auVar48._0_4_;
      auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * fVar96)),auVar54,auVar54);
      auVar48 = vfmadd231ss_fma(auVar48,auVar60,auVar60);
      auVar48 = vfmadd231ss_fma(auVar48,auVar59,auVar59);
      auVar81._12_4_ = 0;
      auVar81._0_12_ = ZEXT812(0);
      auVar81 = auVar81 << 0x20;
      auVar69 = vrsqrt14ss_avx512f(auVar81,ZEXT416((uint)auVar48._0_4_));
      fVar74 = auVar69._0_4_;
      fVar74 = fVar74 * 1.5 + fVar74 * fVar74 * fVar74 * auVar48._0_4_ * -0.5;
      auVar48 = vxorps_avx512vl(ZEXT416(uVar45),auVar53);
      fVar46 = (float)((1 < uVar39) * uVar45 + (uint)(1 >= uVar39) * auVar48._0_4_);
      auVar53 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar46 * fVar74 * auVar54._0_4_)),auVar68,auVar61
                                   );
      auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar74 * fVar96)),auVar68,ZEXT416(uVar2));
      auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar74 * auVar60._0_4_ * fVar46)),auVar68,
                                ZEXT416(uVar3));
      auVar59 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar74 * auVar59._0_4_)),ZEXT416(uVar4),
                                auVar68);
      auVar60 = vsubss_avx512f(auVar62,auVar66);
      auVar55 = vmulss_avx512f(auVar66,auVar55);
      auVar69 = vfmadd231ss_avx512f(auVar55,auVar60,auVar61);
      auVar55 = vmulss_avx512f(auVar66,auVar56);
      auVar55 = vfmadd231ss_fma(auVar55,auVar60,ZEXT416(uVar2));
      auVar56 = vmulss_avx512f(auVar66,auVar57);
      auVar56 = vfmadd231ss_fma(auVar56,auVar60,ZEXT416(uVar3));
      auVar57 = vmulss_avx512f(auVar66,auVar58);
      auVar57 = vfmadd231ss_fma(auVar57,auVar60,ZEXT416(uVar4));
      fVar46 = auVar55._0_4_;
      auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar46 * fVar46)),auVar69,auVar69);
      auVar55 = vfmadd231ss_fma(auVar55,auVar56,auVar56);
      auVar55 = vfmadd231ss_fma(auVar55,auVar57,auVar57);
      auVar58 = vrsqrt14ss_avx512f(auVar81,ZEXT416((uint)auVar55._0_4_));
      fVar74 = auVar58._0_4_;
      fVar74 = fVar74 * 1.5 + fVar74 * fVar74 * fVar74 * auVar55._0_4_ * -0.5;
      vucomiss_avx512f(ZEXT416(0x3f7fdf3b));
      bVar15 = 2 < uVar38;
      auVar70._4_12_ = auVar53._4_12_;
      auVar70._0_4_ =
           (float)((uint)bVar15 * (int)(auVar69._0_4_ * fVar74) + (uint)!bVar15 * auVar53._0_4_);
      auVar71._4_12_ = auVar48._4_12_;
      auVar71._0_4_ = (float)((uint)bVar15 * (int)(fVar46 * fVar74) + (uint)!bVar15 * auVar48._0_4_)
      ;
      auVar72._4_12_ = auVar54._4_12_;
      auVar72._0_4_ =
           (float)((uint)bVar15 * (int)(auVar56._0_4_ * fVar74) + (uint)!bVar15 * auVar54._0_4_);
      auVar73._4_12_ = auVar59._4_12_;
      auVar73._0_4_ =
           (float)((uint)bVar15 * (int)(auVar57._0_4_ * fVar74) + (uint)!bVar15 * auVar59._0_4_);
      auVar130._0_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[0];
      auVar130._4_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[1];
      auVar130._8_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[2];
      auVar130._12_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[3];
      uVar95 = auVar60._0_4_;
      auVar133._4_4_ = uVar95;
      auVar133._0_4_ = uVar95;
      auVar133._8_4_ = uVar95;
      auVar133._12_4_ = uVar95;
      auVar55 = vfmadd231ps_fma(auVar130,auVar133,(undefined1  [16])(pAVar41->l).vx.field_0);
      auVar127._0_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[0];
      auVar127._4_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[1];
      auVar127._8_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[2];
      auVar127._12_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[3];
      auVar54 = vfmadd231ps_fma(auVar127,auVar133,(undefined1  [16])(pAVar41->l).vy.field_0);
      auVar123._0_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[0];
      auVar123._4_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[1];
      auVar123._8_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[2];
      auVar123._12_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[3];
      auVar56 = vfmadd231ps_fma(auVar123,auVar133,(undefined1  [16])(pAVar41->l).vz.field_0);
      auVar119._0_4_ = fVar116 * (pAVar43->p).field_0.m128[0];
      auVar119._4_4_ = fVar116 * (pAVar43->p).field_0.m128[1];
      auVar119._8_4_ = fVar116 * (pAVar43->p).field_0.m128[2];
      auVar119._12_4_ = fVar116 * (pAVar43->p).field_0.m128[3];
      auVar59 = vfmadd231ps_fma(auVar119,auVar133,(undefined1  [16])(pAVar41->p).field_0);
      auVar48 = vshufps_avx(auVar55,auVar81,0xe9);
      auVar48 = vblendps_avx(auVar48,auVar54,4);
      auVar57 = vfmadd213ss_fma(auVar70,auVar70,ZEXT416((uint)(auVar71._0_4_ * auVar71._0_4_)));
      auVar57 = vfnmadd231ss_fma(auVar57,auVar72,auVar72);
      auVar60 = vfnmadd231ss_fma(auVar57,auVar73,auVar73);
      auVar57 = vfmadd213ss_fma(auVar72,auVar71,ZEXT416((uint)(auVar70._0_4_ * auVar73._0_4_)));
      fVar74 = auVar57._0_4_ + auVar57._0_4_;
      auVar57 = vfmsub213ss_fma(auVar73,auVar71,ZEXT416((uint)(auVar70._0_4_ * auVar72._0_4_)));
      fVar116 = auVar57._0_4_ + auVar57._0_4_;
      auVar57 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar73._0_4_)),auVar71,auVar72);
      fVar46 = auVar57._0_4_ + auVar57._0_4_;
      auVar58 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar71._0_4_)),auVar70,auVar70);
      auVar57 = vfmadd213ss_avx512f(auVar72,auVar72,auVar58);
      auVar53 = vfnmadd231ss_avx512f(auVar57,auVar73,auVar73);
      auVar57 = vfmadd213ss_avx512f(auVar73,auVar72,ZEXT416((uint)(auVar70._0_4_ * auVar71._0_4_)));
      auVar69 = vaddss_avx512f(auVar57,auVar57);
      auVar57 = vfmadd213ss_fma(auVar71,auVar73,ZEXT416((uint)(auVar70._0_4_ * auVar72._0_4_)));
      fVar96 = auVar57._0_4_ + auVar57._0_4_;
      auVar57 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar71._0_4_)),auVar72,auVar73);
      fVar13 = auVar57._0_4_ + auVar57._0_4_;
      auVar57 = vfnmadd231ss_fma(auVar58,auVar72,auVar72);
      auVar58 = vfmadd231ss_fma(auVar57,auVar73,auVar73);
      uVar95 = auVar60._0_4_;
      auVar91._4_4_ = uVar95;
      auVar91._0_4_ = uVar95;
      auVar91._8_4_ = uVar95;
      auVar91._12_4_ = uVar95;
      auVar101._4_4_ = fVar74;
      auVar101._0_4_ = fVar74;
      auVar101._8_4_ = fVar74;
      auVar101._12_4_ = fVar74;
      auVar139._0_4_ = fVar116 * 0.0;
      auVar139._4_4_ = fVar116 * 0.0;
      auVar139._8_4_ = fVar116 * 1.0;
      auVar139._12_4_ = fVar116 * 0.0;
      auVar66 = ZEXT816(0x3f80000000000000);
      auVar57 = vfmadd231ps_fma(auVar139,auVar66,auVar101);
      auVar61 = SUB6416(ZEXT464(0x3f800000),0);
      auVar60 = vfmadd231ps_fma(auVar57,auVar61,auVar91);
      auVar92._4_4_ = fVar46;
      auVar92._0_4_ = fVar46;
      auVar92._8_4_ = fVar46;
      auVar92._12_4_ = fVar46;
      auVar57 = vbroadcastss_avx512vl(auVar53);
      auVar53 = vbroadcastss_avx512vl(auVar69);
      auVar138._0_4_ = auVar53._0_4_ * 0.0;
      auVar138._4_4_ = auVar53._4_4_ * 0.0;
      auVar138._8_4_ = auVar53._8_4_ * 1.0;
      auVar138._12_4_ = auVar53._12_4_ * 0.0;
      auVar57 = vfmadd231ps_fma(auVar138,auVar66,auVar57);
      auVar53 = vfmadd231ps_fma(auVar57,auVar61,auVar92);
      auVar93._4_4_ = fVar96;
      auVar93._0_4_ = fVar96;
      auVar93._8_4_ = fVar96;
      auVar93._12_4_ = fVar96;
      auVar102._4_4_ = fVar13;
      auVar102._0_4_ = fVar13;
      auVar102._8_4_ = fVar13;
      auVar102._12_4_ = fVar13;
      fVar74 = auVar58._0_4_;
      auVar114._0_4_ = fVar74 * 0.0;
      auVar114._4_4_ = fVar74 * 0.0;
      auVar114._8_4_ = fVar74 * 1.0;
      auVar114._12_4_ = fVar74 * 0.0;
      auVar57 = vfmadd231ps_fma(auVar114,auVar66,auVar102);
      auVar57 = vfmadd231ps_fma(auVar57,auVar61,auVar93);
      uVar95 = auVar55._0_4_;
      auVar94._4_4_ = uVar95;
      auVar94._0_4_ = uVar95;
      auVar94._8_4_ = uVar95;
      auVar94._12_4_ = uVar95;
      fVar74 = auVar57._0_4_;
      auVar109._0_4_ = fVar74 * 0.0;
      fVar116 = auVar57._4_4_;
      auVar109._4_4_ = fVar116 * 0.0;
      fVar46 = auVar57._8_4_;
      auVar109._8_4_ = fVar46 * 0.0;
      fVar96 = auVar57._12_4_;
      auVar109._12_4_ = fVar96 * 0.0;
      auVar55 = vfmadd213ps_fma(auVar81,auVar53,auVar109);
      auVar58 = vfmadd231ps_fma(auVar55,auVar60,auVar94);
      uVar95 = auVar54._0_4_;
      auVar131._4_4_ = uVar95;
      auVar131._0_4_ = uVar95;
      auVar131._8_4_ = uVar95;
      auVar131._12_4_ = uVar95;
      auVar55 = vshufps_avx(auVar54,auVar54,0x55);
      auVar55 = vfmadd213ps_fma(auVar55,auVar53,auVar109);
      auVar57 = vfmadd231ps_fma(auVar55,auVar60,auVar131);
      uVar95 = auVar56._0_4_;
      auVar128._4_4_ = uVar95;
      auVar128._0_4_ = uVar95;
      auVar128._8_4_ = uVar95;
      auVar128._12_4_ = uVar95;
      auVar55 = vshufps_avx(auVar56,auVar56,0x55);
      auVar54 = vshufps_avx(auVar56,auVar56,0xaa);
      auVar110._0_4_ = auVar54._0_4_ * fVar74;
      auVar110._4_4_ = auVar54._4_4_ * fVar116;
      auVar110._8_4_ = auVar54._8_4_ * fVar46;
      auVar110._12_4_ = auVar54._12_4_ * fVar96;
      auVar55 = vfmadd231ps_fma(auVar110,auVar53,auVar55);
      auVar56 = vfmadd231ps_fma(auVar55,auVar60,auVar128);
      uVar95 = auVar59._0_4_;
      auVar124._4_4_ = uVar95;
      auVar124._0_4_ = uVar95;
      auVar124._8_4_ = uVar95;
      auVar124._12_4_ = uVar95;
      auVar55 = vshufps_avx(auVar59,auVar59,0x55);
      auVar54 = vshufps_avx(auVar59,auVar59,0xaa);
      auVar115._0_4_ = auVar54._0_4_ * fVar74;
      auVar115._4_4_ = auVar54._4_4_ * fVar116;
      auVar115._8_4_ = auVar54._8_4_ * fVar46;
      auVar115._12_4_ = auVar54._12_4_ * fVar96;
      auVar55 = vfmadd231ps_fma(auVar115,auVar53,auVar55);
      auVar55 = vfmadd231ps_fma(auVar55,auVar60,auVar124);
      auVar103._0_4_ = auVar48._0_4_ + 0.0 + auVar55._0_4_;
      auVar103._4_4_ = auVar48._4_4_ + 0.0 + auVar55._4_4_;
      auVar103._8_4_ = auVar48._8_4_ + 0.0 + auVar55._8_4_;
      auVar103._12_4_ = auVar48._12_4_ + 0.0 + auVar55._12_4_;
    }
    else {
      fVar74 = 1.0 - fVar116;
      auVar76._0_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[0];
      auVar76._4_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[1];
      auVar76._8_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[2];
      auVar76._12_4_ = fVar116 * (pAVar43->l).vx.field_0.m128[3];
      auVar111._4_4_ = fVar74;
      auVar111._0_4_ = fVar74;
      auVar111._8_4_ = fVar74;
      auVar111._12_4_ = fVar74;
      auVar58 = vfmadd231ps_fma(auVar76,auVar111,(undefined1  [16])(pAVar41->l).vx.field_0);
      auVar84._0_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[0];
      auVar84._4_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[1];
      auVar84._8_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[2];
      auVar84._12_4_ = fVar116 * (pAVar43->l).vy.field_0.m128[3];
      auVar57 = vfmadd231ps_fma(auVar84,auVar111,(undefined1  [16])(pAVar41->l).vy.field_0);
      auVar104._0_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[0];
      auVar104._4_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[1];
      auVar104._8_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[2];
      auVar104._12_4_ = fVar116 * (pAVar43->l).vz.field_0.m128[3];
      auVar56 = vfmadd231ps_fma(auVar104,auVar111,(undefined1  [16])(pAVar41->l).vz.field_0);
      auVar97._0_4_ = fVar116 * (pAVar43->p).field_0.m128[0];
      auVar97._4_4_ = fVar116 * (pAVar43->p).field_0.m128[1];
      auVar97._8_4_ = fVar116 * (pAVar43->p).field_0.m128[2];
      auVar97._12_4_ = fVar116 * (pAVar43->p).field_0.m128[3];
      auVar103 = vfmadd231ps_fma(auVar97,auVar111,(undefined1  [16])(pAVar41->p).field_0);
    }
    auVar48 = vshufps_avx(auVar56,auVar56,0xc9);
    auVar55 = vshufps_avx(auVar57,auVar57,0xc9);
    auVar120._0_4_ = auVar56._0_4_ * auVar55._0_4_;
    auVar120._4_4_ = auVar56._4_4_ * auVar55._4_4_;
    auVar120._8_4_ = auVar56._8_4_ * auVar55._8_4_;
    auVar120._12_4_ = auVar56._12_4_ * auVar55._12_4_;
    auVar60 = vfmsub231ps_fma(auVar120,auVar57,auVar48);
    auVar54 = vshufps_avx(auVar60,auVar60,0xc9);
    auVar59 = vshufps_avx(auVar58,auVar58,0xc9);
    auVar112._0_4_ = auVar58._0_4_ * auVar48._0_4_;
    auVar112._4_4_ = auVar58._4_4_ * auVar48._4_4_;
    auVar112._8_4_ = auVar58._8_4_ * auVar48._8_4_;
    auVar112._12_4_ = auVar58._12_4_ * auVar48._12_4_;
    auVar53 = vfmsub231ps_fma(auVar112,auVar59,auVar56);
    auVar85._0_4_ = auVar59._0_4_ * auVar57._0_4_;
    auVar85._4_4_ = auVar59._4_4_ * auVar57._4_4_;
    auVar85._8_4_ = auVar59._8_4_ * auVar57._8_4_;
    auVar85._12_4_ = auVar59._12_4_ * auVar57._12_4_;
    auVar56 = vfmsub231ps_fma(auVar85,auVar58,auVar55);
    auVar48 = vshufps_avx(auVar56,auVar56,0xc9);
    auVar55 = vunpcklps_avx(auVar54,auVar48);
    auVar56 = vunpcklps_avx(auVar60,auVar56);
    auVar48 = vinsertps_avx(auVar53,auVar53,0x4a);
    auVar56 = vunpcklps_avx(auVar56,ZEXT416(auVar53._0_4_));
    auVar57 = vunpcklps_avx(auVar55,auVar48);
    auVar55 = vunpckhps_avx(auVar55,auVar48);
    auVar48 = vdpps_avx(auVar58,auVar54,0x7f);
    auVar77._0_4_ = auVar48._0_4_;
    auVar77._4_4_ = auVar77._0_4_;
    auVar77._8_4_ = auVar77._0_4_;
    auVar77._12_4_ = auVar77._0_4_;
    aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar57,auVar77);
    aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar55,auVar77);
    aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vdivps_avx(auVar56,auVar77);
    uVar95 = auVar103._0_4_;
    auVar78._4_4_ = uVar95;
    auVar78._0_4_ = uVar95;
    auVar78._8_4_ = uVar95;
    auVar78._12_4_ = uVar95;
    auVar48 = vshufps_avx(auVar103,auVar103,0x55);
    auVar55 = vshufps_avx(auVar103,auVar103,0xaa);
    auVar98._0_4_ = auVar55._0_4_ * aVar8.m128[0];
    auVar98._4_4_ = auVar55._4_4_ * aVar8.m128[1];
    auVar98._8_4_ = auVar55._8_4_ * aVar8.m128[2];
    auVar98._12_4_ = auVar55._12_4_ * aVar8.m128[3];
    auVar48 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar7,auVar48);
    auVar48 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar6,auVar78);
    auVar25._8_4_ = 0x80000000;
    auVar25._0_8_ = 0x8000000080000000;
    auVar25._12_4_ = 0x80000000;
    aVar47 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vxorps_avx512vl(auVar48,auVar25);
  }
  uVar95 = 2;
  bVar15 = true;
  local_68 = 0.0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar48 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar7,0x7f);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar48 = vandps_avx512vl(auVar48,auVar18);
    if (auVar48._0_4_ <= 1e-05) {
      auVar48 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar8,0x7f);
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar48 = vandps_avx512vl(auVar48,auVar19);
      if (auVar48._0_4_ <= 1e-05) {
        auVar48 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar8,0x7f);
        auVar20._8_4_ = 0x7fffffff;
        auVar20._0_8_ = 0x7fffffff7fffffff;
        auVar20._12_4_ = 0x7fffffff;
        auVar48 = vandps_avx512vl(auVar48,auVar20);
        if (auVar48._0_4_ <= 1e-05) {
          auVar55 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
          auVar54 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
          fVar74 = auVar55._0_4_;
          auVar105._8_4_ = 0x7fffffff;
          auVar105._0_8_ = 0x7fffffff7fffffff;
          auVar105._12_4_ = 0x7fffffff;
          auVar48 = vandps_avx(ZEXT416((uint)(fVar74 - auVar54._0_4_)),auVar105);
          if (auVar48._0_4_ <= 1e-05) {
            auVar56 = vdpps_avx((undefined1  [16])aVar8,(undefined1  [16])aVar8,0x7f);
            auVar48 = vandps_avx(ZEXT416((uint)(fVar74 - auVar56._0_4_)),auVar105);
            if ((auVar48._0_4_ <= 1e-05) &&
               (auVar48 = vandps_avx(ZEXT416((uint)(auVar54._0_4_ - auVar56._0_4_)),auVar105),
               auVar48._0_4_ <= 1e-05)) {
              uVar95 = 1;
              if (fVar74 < 0.0) {
                local_68 = sqrtf(fVar74);
              }
              else {
                auVar48 = vsqrtss_avx(auVar55,auVar55);
                local_68 = auVar48._0_4_;
              }
              bVar15 = false;
            }
          }
        }
      }
    }
  }
  pRVar10 = context->userContext;
  uVar39 = pRVar10->instStackSize;
  pRVar10->instID[uVar39] = prim->instID_;
  pRVar10->instPrimID[uVar39] = 0;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)pRVar10->world2inst[uVar39] = aVar6;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar10->world2inst[uVar39] + 4) = aVar7;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar10->world2inst[uVar39] + 8) = aVar8;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pRVar10->world2inst[uVar39] + 0xc) = aVar47;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)pRVar10->inst2world[uVar39] = aVar49;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pRVar10->inst2world[uVar39] + 4) = aVar50;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pRVar10->inst2world[uVar39] + 8) = aVar51;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pRVar10->inst2world[uVar39] + 0xc) = aVar52;
  pRVar10->instStackSize = pRVar10->instStackSize + 1;
  local_cc = query->time;
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar48 = vfmadd132ps_avx512vl((undefined1  [16])aVar8,(undefined1  [16])aVar47,auVar21);
  uVar1 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar48 = vfmadd231ps_avx512vl(auVar48,(undefined1  [16])aVar7,auVar22);
  uVar1 = *(undefined4 *)&(query->p).field_0;
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar48 = vfmadd231ps_avx512vl(auVar48,(undefined1  [16])aVar6,auVar23);
  local_d8 = vmovlps_avx(auVar48);
  local_d0 = vextractps_avx(auVar48,2);
  local_c8 = local_68 * query->radius;
  local_98 = *(long *)&(pIVar9->super_Geometry).field_0x58;
  local_88 = context->query_ws;
  local_60 = context->userPtr;
  local_90 = 0;
  local_78._0_8_ = context->func;
  local_78._8_8_ = context->userContext;
  local_58 = 0xffffffffffffffff;
  fVar74 = local_88->radius;
  local_48._4_4_ = fVar74;
  local_48._0_4_ = fVar74;
  local_48._8_4_ = fVar74;
  local_48._12_4_ = fVar74;
  if (bVar15) {
    if (fVar74 < INFINITY) {
      lVar37 = vpextrq_avx(local_78,1);
      if (*(int *)(lVar37 + 0x88) != 0) {
        lVar40 = (ulong)(*(int *)(lVar37 + 0x88) - 1) * 0x40;
        auVar48 = *(undefined1 (*) [16])(lVar37 + lVar40);
        auVar55 = *(undefined1 (*) [16])(lVar37 + 0x10 + lVar40);
        auVar54 = *(undefined1 (*) [16])(lVar37 + 0x20 + lVar40);
        auVar56 = *(undefined1 (*) [16])(lVar37 + 0x30 + lVar40);
        auVar117._4_4_ = fVar74;
        auVar117._0_4_ = fVar74;
        auVar117._8_4_ = fVar74;
        auVar117._12_4_ = fVar74;
        auVar60 = vfnmadd213ps_fma(auVar54,auVar117,auVar56);
        auVar53 = vfnmadd213ps_fma(auVar55,auVar117,auVar60);
        auVar57 = vfnmadd213ps_fma(auVar48,auVar117,auVar53);
        auVar132._8_4_ = 0x7f800000;
        auVar132._0_8_ = 0x7f8000007f800000;
        auVar132._12_4_ = 0x7f800000;
        auVar134._8_4_ = 0xff800000;
        auVar134._0_8_ = 0xff800000ff800000;
        auVar134._12_4_ = 0xff800000;
        auVar58 = vminps_avx(auVar132,auVar57);
        auVar57 = vmaxps_avx(auVar134,auVar57);
        auVar59 = vfmadd213ps_fma(auVar54,local_48,auVar56);
        auVar69 = vfnmadd213ps_fma(auVar55,auVar117,auVar59);
        auVar54 = vfnmadd213ps_fma(auVar48,auVar117,auVar69);
        auVar56 = vminps_avx(auVar58,auVar54);
        auVar54 = vmaxps_avx(auVar57,auVar54);
        auVar57 = vfmadd231ps_fma(auVar60,local_48,auVar55);
        auVar58 = vfnmadd213ps_fma(auVar48,auVar117,auVar57);
        auVar56 = vminps_avx(auVar56,auVar58);
        auVar54 = vmaxps_avx(auVar54,auVar58);
        auVar58 = vfmadd231ps_fma(auVar59,local_48,auVar55);
        auVar55 = vfnmadd213ps_fma(auVar117,auVar48,auVar58);
        auVar56 = vminps_avx(auVar56,auVar55);
        auVar55 = vmaxps_avx(auVar54,auVar55);
        auVar59 = vfmadd231ps_fma(auVar53,local_48,auVar48);
        auVar54 = vminps_avx(auVar56,auVar59);
        auVar55 = vmaxps_avx(auVar55,auVar59);
        auVar56 = vfmadd231ps_fma(auVar69,local_48,auVar48);
        auVar54 = vminps_avx(auVar54,auVar56);
        auVar55 = vmaxps_avx(auVar55,auVar56);
        auVar56 = vfmadd231ps_fma(auVar57,local_48,auVar48);
        auVar54 = vminps_avx(auVar54,auVar56);
        auVar55 = vmaxps_avx(auVar55,auVar56);
        auVar48 = vfmadd231ps_fma(auVar58,local_48,auVar48);
        auVar54 = vminps_avx(auVar54,auVar48);
        auVar48 = vmaxps_avx(auVar55,auVar48);
        auVar48 = vsubps_avx(auVar48,auVar54);
        auVar24._8_4_ = 0x3f000000;
        auVar24._0_8_ = 0x3f0000003f000000;
        auVar24._12_4_ = 0x3f000000;
        local_48 = vmulps_avx512vl(auVar48,auVar24);
      }
    }
  }
  else {
    fVar74 = local_68 * fVar74;
    local_48._4_4_ = fVar74;
    local_48._0_4_ = fVar74;
    local_48._8_4_ = fVar74;
    local_48._12_4_ = fVar74;
  }
  local_80 = uVar95;
  uVar36 = (**(code **)(local_98 + 0x88))(local_98 + 0x58,&local_d8);
  pRVar10 = context->userContext;
  uVar39 = pRVar10->instStackSize - 1;
  pRVar10->instStackSize = uVar39;
  pRVar10->instID[uVar39] = 0xffffffff;
  pRVar10->instPrimID[pRVar10->instStackSize] = 0xffffffff;
  return (bool)uVar36;
}

Assistant:

bool InstanceIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      const AffineSpace3fa local2world = instance->getLocal2World(query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, 0, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;
        
        PointQueryContext context_inst(
          (Scene*)instance->object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = instance->object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }